

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_cf_socket_peek(Curl_cfilter *cf,Curl_easy *data,curl_socket_t *psock,
                            Curl_sockaddr_ex **paddr,ip_quadruple *pip)

{
  void *pvVar1;
  _Bool _Var2;
  cf_socket_ctx *ctx;
  ip_quadruple *pip_local;
  Curl_sockaddr_ex **paddr_local;
  curl_socket_t *psock_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  _Var2 = cf_is_socket(cf);
  if ((_Var2) && (cf->ctx != (void *)0x0)) {
    pvVar1 = cf->ctx;
    if (psock != (curl_socket_t *)0x0) {
      *psock = *(curl_socket_t *)((long)pvVar1 + 0x98);
    }
    if (paddr != (Curl_sockaddr_ex **)0x0) {
      *paddr = (Curl_sockaddr_ex *)((long)pvVar1 + 8);
    }
    if (pip != (ip_quadruple *)0x0) {
      memcpy(pip,(void *)((long)pvVar1 + 0x9c),100);
    }
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    cf_local._4_4_ = CURLE_FAILED_INIT;
  }
  return cf_local._4_4_;
}

Assistant:

CURLcode Curl_cf_socket_peek(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             curl_socket_t *psock,
                             const struct Curl_sockaddr_ex **paddr,
                             struct ip_quadruple *pip)
{
  (void)data;
  if(cf_is_socket(cf) && cf->ctx) {
    struct cf_socket_ctx *ctx = cf->ctx;

    if(psock)
      *psock = ctx->sock;
    if(paddr)
      *paddr = &ctx->addr;
    if(pip)
      *pip = ctx->ip;
    return CURLE_OK;
  }
  return CURLE_FAILED_INIT;
}